

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::to_tmp(SSPMSolver *this,int idx)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  reference local_50;
  reference local_40;
  
  iVar4 = this->l;
  iVar6 = idx * iVar4;
  for (uVar7 = 0; (long)uVar7 < (long)iVar4; uVar7 = uVar7 + 1) {
    uVar1 = (long)iVar6 + uVar7;
    local_40._mask = 1L << (uVar1 & 0x3f);
    local_40._block = (this->pm_b)._bits + (uVar1 >> 6);
    local_50._mask = 1L << (uVar7 & 0x3f);
    local_50._block = (this->tmp_b)._bits + (uVar7 >> 6);
    bitset::reference::operator=(&local_50,&local_40);
    iVar4 = this->l;
  }
  piVar2 = this->tmp_d;
  piVar3 = this->pm_d;
  for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
    piVar2[lVar5] = piVar3[iVar6 + lVar5];
    iVar4 = this->l;
  }
  return;
}

Assistant:

void
SSPMSolver::to_tmp(int idx)
{
    int base = idx*l;
    for (int i=0; i<l; i++) tmp_b[i] = pm_b[base+i];
    for (int i=0; i<l; i++) tmp_d[i] = pm_d[base+i];
}